

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_load.cpp
# Opt level: O0

bool __thiscall OPNMIDIplay::LoadBank(OPNMIDIplay *this,FileAndMemReader *fr)

{
  bool bVar1;
  size_t __size;
  void *mem;
  WOPNFile *file;
  Bank *pBVar2;
  long lVar3;
  WOPNInstrument *inIns;
  OpnInstMeta *ins;
  int j;
  Bank *bank;
  size_t bankno;
  size_t i;
  size_t ss;
  WOPNBank *slots_src_ins [2];
  uint16_t local_4c [2];
  OPN2 *pOStack_48;
  uint16_t slots_counts [2];
  Synth *synth;
  size_t fsize;
  char *raw_file_data;
  WOPNFile *wopn;
  FileAndMemReader *pFStack_20;
  int err;
  FileAndMemReader *fr_local;
  OPNMIDIplay *this_local;
  
  wopn._4_4_ = 0;
  pFStack_20 = fr;
  fr_local = (FileAndMemReader *)this;
  bVar1 = FileAndMemReader::isValid(fr);
  if (bVar1) {
    __size = FileAndMemReader::fileSize(pFStack_20);
    FileAndMemReader::seek(pFStack_20,0,0);
    mem = malloc(__size);
    if (mem == (void *)0x0) {
      std::__cxx11::string::operator=
                ((string *)&this->errorStringOut,"Custom bank: Out of memory before of read!");
      this_local._7_1_ = false;
    }
    else {
      FileAndMemReader::read(pFStack_20,(int)mem,(void *)0x1,__size);
      file = WOPN_LoadBankFromMem(mem,__size,(int *)((long)&wopn + 4));
      free(mem);
      if (file == (WOPNFile *)0x0) {
        switch(wopn._4_4_) {
        case 1:
          std::__cxx11::string::operator=
                    ((string *)&this->errorStringOut,"Custom bank: Invalid magic!");
          this_local._7_1_ = false;
          break;
        case 2:
          std::__cxx11::string::operator=
                    ((string *)&this->errorStringOut,"Custom bank: Unexpected ending!");
          this_local._7_1_ = false;
          break;
        case 3:
          std::__cxx11::string::operator=
                    ((string *)&this->errorStringOut,"Custom bank: Invalid banks count!");
          this_local._7_1_ = false;
          break;
        case 4:
          std::__cxx11::string::operator=
                    ((string *)&this->errorStringOut,
                     "Custom bank: Version is newer than supported by this library!");
          this_local._7_1_ = false;
          break;
        case 5:
          std::__cxx11::string::operator=
                    ((string *)&this->errorStringOut,"Custom bank: Out of memory!");
          this_local._7_1_ = false;
          break;
        default:
          std::__cxx11::string::operator=
                    ((string *)&this->errorStringOut,"Custom bank: Unknown error!");
          this_local._7_1_ = false;
        }
      }
      else {
        pOStack_48 = AdlMIDI_UPtr<OPN2,_ADLMIDI_DefaultDelete<OPN2>_>::operator*(&this->m_synth);
        (pOStack_48->m_insBankSetup).volumeModel = (uint)file->volume_model;
        (pOStack_48->m_insBankSetup).lfoEnable = (uint)((file->lfo_freq & 8) != 0);
        (pOStack_48->m_insBankSetup).lfoFrequency = file->lfo_freq & 7;
        (pOStack_48->m_insBankSetup).chipType = (uint)file->chip_type;
        (pOStack_48->m_insBankSetup).mt32defaults = false;
        (this->m_setup).VolumeModel = 0;
        (this->m_setup).lfoEnable = -1;
        (this->m_setup).lfoFrequency = -1;
        (this->m_setup).chipType = -1;
        BasicBankMap<OPN2::Bank>::clear(&pOStack_48->m_insBanks);
        local_4c[0] = file->banks_count_melodic;
        local_4c[1] = file->banks_count_percussion;
        slots_src_ins[0] = file->banks_percussive;
        for (i = 0; i < 2; i = i + 1) {
          for (bankno = 0; bankno < local_4c[i]; bankno = bankno + 1) {
            lVar3 = 0;
            if (i != 0) {
              lVar3 = 0x8000;
            }
            pBVar2 = BasicBankMap<OPN2::Bank>::operator[]
                               (&pOStack_48->m_insBanks,
                                (int)((uint)slots_src_ins[i - 1][bankno].bank_midi_msb * 0x100 +
                                     (uint)slots_src_ins[i - 1][bankno].bank_midi_lsb) + lVar3);
            for (ins._4_4_ = 0; ins._4_4_ < 0x80; ins._4_4_ = ins._4_4_ + 1) {
              memset(pBVar2->ins + ins._4_4_,0,0x4f);
              cvt_generic_to_FMIns<WOPNInstrument>
                        (pBVar2->ins + ins._4_4_,slots_src_ins[i - 1][bankno].ins + ins._4_4_);
            }
          }
        }
        applySetup(this);
        WOPN_Free(file);
        this_local._7_1_ = true;
      }
    }
  }
  else {
    std::__cxx11::string::operator=
              ((string *)&this->errorStringOut,"Custom bank: Invalid data stream!");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool OPNMIDIplay::LoadBank(FileAndMemReader &fr)
{
    int err = 0;
    WOPNFile *wopn = NULL;
    char *raw_file_data = NULL;
    size_t  fsize;
    if(!fr.isValid())
    {
        errorStringOut = "Custom bank: Invalid data stream!";
        return false;
    }

    // Read complete bank file into the memory
    fsize = fr.fileSize();
    fr.seek(0, FileAndMemReader::SET);
    // Allocate necessary memory block
    raw_file_data = (char*)malloc(fsize);
    if(!raw_file_data)
    {
        errorStringOut = "Custom bank: Out of memory before of read!";
        return false;
    }
    fr.read(raw_file_data, 1, fsize);

    // Parse bank file from the memory
    wopn = WOPN_LoadBankFromMem((void*)raw_file_data, fsize, &err);
    //Free the buffer no more needed
    free(raw_file_data);

    // Check for any erros
    if(!wopn)
    {
        switch(err)
        {
        case WOPN_ERR_BAD_MAGIC:
            errorStringOut = "Custom bank: Invalid magic!";
            return false;
        case WOPN_ERR_UNEXPECTED_ENDING:
            errorStringOut = "Custom bank: Unexpected ending!";
            return false;
        case WOPN_ERR_INVALID_BANKS_COUNT:
            errorStringOut = "Custom bank: Invalid banks count!";
            return false;
        case WOPN_ERR_NEWER_VERSION:
            errorStringOut = "Custom bank: Version is newer than supported by this library!";
            return false;
        case WOPN_ERR_OUT_OF_MEMORY:
            errorStringOut = "Custom bank: Out of memory!";
            return false;
        default:
            errorStringOut = "Custom bank: Unknown error!";
            return false;
        }
    }

    Synth &synth = *m_synth;
    synth.m_insBankSetup.volumeModel = wopn->volume_model;
    synth.m_insBankSetup.lfoEnable = (wopn->lfo_freq & 8) != 0;
    synth.m_insBankSetup.lfoFrequency = wopn->lfo_freq & 7;
    synth.m_insBankSetup.chipType = wopn->chip_type;
    // FIXME: Implement the bank-side flag to enable this
    synth.m_insBankSetup.mt32defaults = false;
    m_setup.VolumeModel = OPNMIDI_VolumeModel_AUTO;
    m_setup.lfoEnable = -1;
    m_setup.lfoFrequency = -1;
    m_setup.chipType = -1;

    synth.m_insBanks.clear();

    uint16_t slots_counts[2] = {wopn->banks_count_melodic, wopn->banks_count_percussion};
    WOPNBank *slots_src_ins[2] = { wopn->banks_melodic, wopn->banks_percussive };

    for(size_t ss = 0; ss < 2; ss++)
    {
        for(size_t i = 0; i < slots_counts[ss]; i++)
        {
            size_t bankno = (slots_src_ins[ss][i].bank_midi_msb * 256) +
                            (slots_src_ins[ss][i].bank_midi_lsb) +
                            (ss ? size_t(Synth::PercussionTag) : 0);
            Synth::Bank &bank = synth.m_insBanks[bankno];
            for(int j = 0; j < 128; j++)
            {
                OpnInstMeta &ins = bank.ins[j];
                std::memset(&ins, 0, sizeof(OpnInstMeta));
                WOPNInstrument &inIns = slots_src_ins[ss][i].ins[j];
                cvt_generic_to_FMIns(ins, inIns);
            }
        }
    }

    applySetup();

    WOPN_Free(wopn);

    return true;
}